

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.h
# Opt level: O0

void __thiscall ast::Dir_equ::~Dir_equ(Dir_equ *this)

{
  Dir_equ *this_local;
  
  ~Dir_equ(this);
  operator_delete(this);
  return;
}

Assistant:

string listing() {
		return string_printf("%4d%10c\t", location.line, ' ');
	}